

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O3

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::CreateView
          (BufferBase<Diligent::EngineVkImplTraits> *this,BufferViewDesc *ViewDesc,
          IBufferView **ppView)

{
  BUFFER_VIEW_TYPE BVar1;
  char (*in_R8) [55];
  string msg;
  string local_40;
  
  BVar1 = ViewDesc->ViewType;
  if (BVar1 == BUFFER_VIEW_UNDEFINED) {
    FormatString<char[34]>(&local_40,(char (*) [34])"Buffer view type is not specified");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x7d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    BVar1 = ViewDesc->ViewType;
  }
  if (BVar1 == BUFFER_VIEW_UNORDERED_ACCESS) {
    if (((this->
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         ).m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != BIND_NONE) goto LAB_0019e20f;
    FormatString<char[38],char_const*,char[55]>
              (&local_40,(Diligent *)"Attempting to create UAV for buffer \'",
               (char (*) [38])
               &(this->
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_UNORDERED_ACCESS flag",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x81);
  }
  else if (BVar1 == BUFFER_VIEW_SHADER_RESOURCE) {
    if (((this->
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         ).m_Desc.BindFlags & BIND_SHADER_RESOURCE) != BIND_NONE) goto LAB_0019e20f;
    FormatString<char[38],char_const*,char[54]>
              (&local_40,(Diligent *)"Attempting to create SRV for buffer \'",
               (char (*) [38])
               &(this->
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_SHADER_RESOURCE flag",
               (char (*) [54])in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x7f);
  }
  else {
    FormatString<char[28]>(&local_40,(char (*) [28])"Unexpected buffer view type");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x83);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
LAB_0019e20f:
  (**(code **)((long)(this->
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                     ).super_ObjectBase<Diligent::IBufferVk>.
                     super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.super_IBuffer.
                     super_IDeviceObject.super_IObject + 0xb8))(this,ViewDesc,ppView,0);
  return;
}

Assistant:

CreateView(const struct BufferViewDesc& ViewDesc, IBufferView** ppView) override
    {
        DEV_CHECK_ERR(ViewDesc.ViewType != BUFFER_VIEW_UNDEFINED, "Buffer view type is not specified");
        if (ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_SHADER_RESOURCE, "Attempting to create SRV for buffer '", this->m_Desc.Name, "' that was not created with BIND_SHADER_RESOURCE flag");
        else if (ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS, "Attempting to create UAV for buffer '", this->m_Desc.Name, "' that was not created with BIND_UNORDERED_ACCESS flag");
        else
            UNEXPECTED("Unexpected buffer view type");

        CreateViewInternal(ViewDesc, ppView, false);
    }